

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow.c
# Opt level: O1

void borg_init_flow(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  borg_data_flow = (borg_data *)mem_zalloc(0x330c);
  borg_data_cost = (borg_data *)mem_zalloc(0x330c);
  borg_data_hard = (borg_data *)mem_zalloc(0x330c);
  borg_data_know = (borg_data *)mem_zalloc(0x330c);
  borg_data_icky = (borg_data *)mem_zalloc(0x330c);
  lVar1 = 0;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      borg_data_hard->data[0][lVar3 + lVar1] = 0xff;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xc6);
    lVar2 = lVar2 + 1;
    lVar1 = lVar1 + 0xc6;
  } while (lVar2 != 0x42);
  track_step.num = 0;
  track_step.size = 100;
  track_step.x = (int *)mem_zalloc(400);
  track_step.y = (int *)mem_zalloc(400);
  track_door.num = 0;
  track_door.size = 100;
  track_door.x = (int *)mem_zalloc(400);
  track_door.y = (int *)mem_zalloc(400);
  track_closed.num = 0;
  track_closed.size = 100;
  track_closed.x = (int *)mem_zalloc(400);
  track_closed.y = (int *)mem_zalloc(400);
  borg_init_flow_stairs();
  borg_init_flow_glyph();
  borg_init_flow_misc();
  return;
}

Assistant:

void borg_init_flow(void)
{
    int x, y;

    /*** Grid data ***/

    /* Allocate */
    borg_data_flow = mem_zalloc(sizeof(borg_data));

    /* Allocate */
    borg_data_cost = mem_zalloc(sizeof(borg_data));

    /* Allocate */
    borg_data_hard = mem_zalloc(sizeof(borg_data));

    /* Allocate */
    borg_data_know = mem_zalloc(sizeof(borg_data));

    /* Allocate */
    borg_data_icky = mem_zalloc(sizeof(borg_data));

    /* Prepare "borg_data_hard" */
    for (y = 0; y < AUTO_MAX_Y; y++) {
        for (x = 0; x < AUTO_MAX_X; x++) {
            /* Prepare "borg_data_hard" */
            borg_data_hard->data[y][x] = 255;
        }
    }

    /* Track Steps */
    borg_init_track(&track_step, 100);

    /* Track doors closed by borg */
    borg_init_track(&track_door, 100);

    /* Track closed doors on map */
    borg_init_track(&track_closed, 100);

    borg_init_flow_stairs();
    borg_init_flow_glyph();
    borg_init_flow_misc();
}